

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_array.cpp
# Opt level: O2

void __thiscall
VertexArray::add_vertex_buffer(VertexArray *this,shared_ptr<VertexBuffer> *vbo,bool instanced)

{
  GLuint GVar1;
  element_type *peVar2;
  pointer pBVar3;
  PFNGLVERTEXATTRIBPOINTERPROC p_Var4;
  uint32_t uVar5;
  GLenum GVar6;
  ulong uVar7;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *__addr;
  sockaddr *extraout_RDX_03;
  long lVar8;
  byte bVar9;
  shared_ptr<VertexBuffer> *psVar10;
  BufferElement *this_00;
  byte local_54;
  
  peVar2 = (vbo->super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar10 = vbo;
  (*glad_glBindVertexArray)(this->m_id);
  pBVar3 = (peVar2->m_layout).elements.
           super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __addr = extraout_RDX;
  for (this_00 = (peVar2->m_layout).elements.
                 super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pBVar3; this_00 = this_00 + 1) {
    if (this_00->type < (UInt3|Float)) {
      uVar7 = 0x1ff9f;
      if ((0x1ff9fU >> (this_00->type & (UInt3|UInt2)) & 1) == 0) {
        uVar5 = BufferElement::components_count(this_00);
        lVar8 = 0;
        __addr = extraout_RDX_02;
        for (bVar9 = 0; local_54 = (byte)uVar5, bVar9 < local_54; bVar9 = bVar9 + 1) {
          VertexBuffer::bind((vbo->super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr,(int)psVar10,__addr,(socklen_t)uVar7);
          p_Var4 = glad_glVertexAttribPointer;
          GVar1 = this->binding_index;
          GVar6 = element_to_shader_type(this_00->type);
          uVar7 = (ulong)this_00->normalized;
          (*p_Var4)(GVar1,uVar5 & 0xff,GVar6,this_00->normalized,(peVar2->m_layout).stride,
                    (void *)((ulong)this_00->offset + lVar8));
          (*glad_glEnableVertexAttribArray)(this->binding_index);
          psVar10 = (shared_ptr<VertexBuffer> *)0x1;
          (*glad_glVertexAttribDivisor)(this->binding_index,1);
          this->binding_index = this->binding_index + 1;
          lVar8 = lVar8 + (ulong)((uVar5 & 0xff) * 4);
          __addr = extraout_RDX_03;
        }
      }
      else {
        VertexBuffer::bind((vbo->super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr,(int)psVar10,__addr,0x1ff9f);
        p_Var4 = glad_glVertexAttribPointer;
        GVar1 = this->binding_index;
        uVar5 = BufferElement::components_count(this_00);
        GVar6 = element_to_shader_type(this_00->type);
        psVar10 = (shared_ptr<VertexBuffer> *)(ulong)uVar5;
        (*p_Var4)(GVar1,uVar5,GVar6,this_00->normalized,(peVar2->m_layout).stride,
                  (void *)(ulong)this_00->offset);
        (*glad_glEnableVertexAttribArray)(this->binding_index);
        __addr = extraout_RDX_00;
        if (instanced) {
          psVar10 = (shared_ptr<VertexBuffer> *)0x1;
          (*glad_glVertexAttribDivisor)(this->binding_index,1);
          __addr = extraout_RDX_01;
        }
        this->binding_index = this->binding_index + 1;
      }
    }
  }
  std::vector<std::shared_ptr<VertexBuffer>,_std::allocator<std::shared_ptr<VertexBuffer>_>_>::
  push_back(&this->m_vertexBuffers,vbo);
  return;
}

Assistant:

void VertexArray::add_vertex_buffer(const std::shared_ptr<VertexBuffer>& vbo, 
                                    bool instanced)
{
    const auto& layout = vbo->layout();
    massert(layout.get_elements().size(), "Vertex buffer has no buffer elements!");

    bind();

    for (const auto& e : layout)
    {
        switch(e.type)
        {
            case ElementType::Float: 
            case ElementType::Float2:
            case ElementType::Float3:
            case ElementType::Float4:
            case ElementType::Int:   
            case ElementType::Int2:  
            case ElementType::Int3:  
            case ElementType::Int4:  
            case ElementType::UInt8:
            case ElementType::UInt8_2:
            case ElementType::UInt8_3:
            case ElementType::UInt: 
            case ElementType::UInt2: 
            case ElementType::UInt3: 
            case ElementType::Bool:  
            {
#if OPENGL_VERSION >= 45
                // TODO offset x relativeoffset
                glVertexArrayVertexBuffer(m_id, binding_index, vbo->ID(), 
                                          0, layout.get_stride());
                glEnableVertexArrayAttrib(m_id, binding_index);

                glVertexArrayAttribFormat(m_id, binding_index, 
                                          e.components_count(), 
                                          element_to_shader_type(e.type),
                                          e.normalized ? GL_TRUE : GL_FALSE, 
                                          e.offset);
                glVertexArrayAttribBinding(m_id, binding_index, binding_index);
#elif OPENGL_VERSION >= 43
                glBindVertexBuffer(binding_index, vbo->ID(), 
                                   0, layout.get_stride());            
                glEnableVertexAttribArray(binding_index);

                glVertexAttribFormat(binding_index, 
                                     e.components_count(), 
                                     element_to_shader_type(e.type),
                                     e.normalized ? GL_TRUE : GL_FALSE, 
                                     e.offset);
                glVertexAttribBinding(binding_index, binding_index);
#else
                vbo->bind();
                glVertexAttribPointer(binding_index, 
                                      e.components_count(), 
                                      element_to_shader_type(e.type),
                                      e.normalized ? GL_TRUE : GL_FALSE, 
                                      layout.get_stride(),
                                      (void*)e.offset);
                glEnableVertexAttribArray(binding_index);
#endif

                if (instanced)
                    glVertexAttribDivisor(binding_index, 1);

                binding_index++;
                break;
            }
            case ElementType::Mat3:  
            case ElementType::Mat4:  
            {
                uint8_t count = e.components_count();
                for (uint8_t i = 0; i < count; ++i)
                {
#if OPENGL_VERSION >= 45
                    glVertexArrayVertexBuffer(m_id, binding_index, vbo->ID(), 
                                              0, layout.get_stride());
                    glEnableVertexArrayAttrib(m_id, binding_index);

                    glVertexArrayAttribFormat(m_id, binding_index, 
                                              count, 
                                              element_to_shader_type(e.type),
                                              e.normalized ? GL_TRUE : GL_FALSE, 
                                              e.offset + i * count * sizeof(float));
                    glVertexArrayAttribBinding(m_id, binding_index, binding_index);
#elif OPENGL_VERSION >= 43
                    glBindVertexBuffer(binding_index, vbo->ID(), 
                                       0, layout.get_stride());            
                    glEnableVertexAttribArray(binding_index);

                    glVertexAttribFormat(binding_index, 
                                         count, 
                                         element_to_shader_type(e.type),
                                         e.normalized ? GL_TRUE : GL_FALSE, 
                                         e.offset + i * count * sizeof(float));
                    glVertexAttribBinding(binding_index, binding_index);
#else
                    vbo->bind();
                    glVertexAttribPointer(binding_index, 
                                          count, 
                                          element_to_shader_type(e.type),
                                          e.normalized ? GL_TRUE : GL_FALSE, 
                                          layout.get_stride(),
                                          (void*)(e.offset + i * count * sizeof(float)));

                    glEnableVertexAttribArray(binding_index);
#endif
                    // Per instance (GLSL vec4 limitation)
                    glVertexAttribDivisor(binding_index, 1);

                    binding_index++;
                }
                break;
            }
            default:
                massert(false, "Unknown buffer element data type!");
        }
    }

    m_vertexBuffers.push_back(vbo);
}